

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O2

ResponseLine * __thiscall
JoinGenericCommand::trigger(JoinGenericCommand *this,string_view parameters)

{
  ResponseLine *pRVar1;
  size_t sVar2;
  long lVar3;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  sVar2 = parameters._M_len;
  lVar3 = IRCCommand::selected_server;
  if ((IRCCommand::selected_server == 0) &&
     (lVar3 = IRCCommand::active_server, IRCCommand::active_server == 0)) {
    pRVar1 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar1,0x2b,"Error: No IRC server is currently selected.",2);
  }
  else if (sVar2 == 0) {
    pRVar1 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar1,0x3c,"Error: Too Few Parameters. Syntax: join <channel> [password]",2);
  }
  else {
    local_40._M_len = 2;
    local_40._M_str = " \t";
    local_30._M_len = sVar2;
    local_30._M_str = parameters._M_str;
    jessilib::
    word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              (&parameters_split,&local_30,&local_40);
    if (parameters_split.second._M_len == 0) {
      Jupiter::IRC::Client::joinChannel(lVar3,sVar2,parameters._M_str);
    }
    else {
      Jupiter::IRC::Client::joinChannel
                (lVar3,parameters_split.first._M_len,parameters_split.first._M_str,
                 parameters_split.second._M_len,parameters_split.second._M_str);
    }
    pRVar1 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar1,0x26,"Request to join channel has been sent.",0);
  }
  return pRVar1;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *JoinGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	if (parameters.empty())
		return new Jupiter::GenericCommand::ResponseLine("Error: Too Few Parameters. Syntax: join <channel> [password]"sv, GenericCommand::DisplayType::PublicError);

	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		server->joinChannel(parameters);
	}
	else {
		server->joinChannel(parameters_split.first, parameters_split.second);
	}

	return new Jupiter::GenericCommand::ResponseLine("Request to join channel has been sent."sv, GenericCommand::DisplayType::PublicSuccess);
}